

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall
MT32Emu::Synth::readMemoryRegion
          (Synth *this,MemoryRegion *region,Bit32u addr,Bit32u len,Bit8u *data)

{
  bool bVar1;
  int __fd;
  uint uVar2;
  Bit32u BVar3;
  uint local_34;
  uint m;
  uint off;
  uint first;
  Bit8u *data_local;
  Bit32u len_local;
  Bit32u addr_local;
  MemoryRegion *region_local;
  Synth *this_local;
  
  __fd = MemoryRegion::firstTouched(region,addr);
  uVar2 = MemoryRegion::firstTouchedOffset(region,addr);
  BVar3 = MemoryRegion::getClampedLen(region,addr,len);
  bVar1 = MemoryRegion::isReadable(region);
  if (bVar1) {
    MemoryRegion::read(region,__fd,(void *)(ulong)uVar2,(size_t)data);
  }
  else {
    for (local_34 = 0; local_34 < BVar3; local_34 = local_34 + 2) {
      data[local_34] = 0xff;
      if (local_34 + 1 < BVar3) {
        data[local_34 + 1] = (Bit8u)region->type;
      }
    }
  }
  return;
}

Assistant:

void Synth::readMemoryRegion(const MemoryRegion *region, Bit32u addr, Bit32u len, Bit8u *data) {
	unsigned int first = region->firstTouched(addr);
	//unsigned int last = region->lastTouched(addr, len);
	unsigned int off = region->firstTouchedOffset(addr);
	len = region->getClampedLen(addr, len);

	unsigned int m;

	if (region->isReadable()) {
		region->read(first, off, data, len);
	} else {
		// FIXME: We might want to do these properly in future
		for (m = 0; m < len; m += 2) {
			data[m] = 0xff;
			if (m + 1 < len) {
				data[m+1] = Bit8u(region->type);
			}
		}
	}
}